

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setopt.c
# Opt level: O1

CURLcode Curl_vsetopt(Curl_easy *data,CURLoption option,__va_list_tag *param)

{
  uint *puVar1;
  undefined1 *puVar2;
  curl_slist *pcVar3;
  curl_blob *blob;
  char *pcVar4;
  Curl_share *pCVar5;
  Curl_share *pCVar6;
  FILE *pFVar7;
  curl_read_callback p_Var8;
  _Bool _Var9;
  byte bVar10;
  ushort uVar11;
  unsigned_short uVar12;
  uint uVar13;
  CURLoption CVar14;
  ulong *puVar15;
  long *plVar16;
  undefined8 *puVar17;
  altsvcinfo *paVar18;
  ulong uVar19;
  code *pcVar20;
  hsts *phVar21;
  byte bVar22;
  ushort uVar23;
  ulong uVar24;
  ulong uVar25;
  curl_progress_callback p_Var26;
  PslCache *pPVar27;
  ssl_config_data *psVar28;
  curl_blob **blobp;
  hsts **hp;
  CURLcode CVar29;
  
  if (9999 < option) {
    if (option < 20000) {
      if ((int)option < 0x2778) {
        uVar19 = (ulong)(option - CURLOPT_HTTPHEADER);
        if (option - CURLOPT_HTTPHEADER < 0x30) {
          if ((0x800000010021U >> (uVar19 & 0x3f) & 1) != 0) goto LAB_001544cd;
          if (uVar19 == 1) {
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              puVar17 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar17 + 1;
            }
            (data->set).httppost = (curl_httppost *)*puVar17;
            (data->set).method = '\x02';
            goto LAB_00154c49;
          }
          if (uVar19 == 0xe) {
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              plVar16 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar16 + 1;
            }
            pFVar7 = (FILE *)*plVar16;
            (data->set).err = pFVar7;
            if (pFVar7 == (FILE *)0x0) {
              (data->set).err = _stderr;
              return CURLE_OK;
            }
            return CURLE_OK;
          }
        }
        if (option != CURLOPT_PREQUOTE) {
          if (option == CURLOPT_SHARE) {
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              plVar16 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar16 + 1;
            }
            pCVar5 = (Curl_share *)*plVar16;
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
              pCVar6 = data->share;
              if (pCVar6->cookies == data->cookies) {
                data->cookies = (CookieInfo *)0x0;
              }
              if (pCVar6->hsts == data->hsts) {
                data->hsts = (hsts *)0x0;
              }
              if (data->psl == &pCVar6->psl) {
                pPVar27 = &data->multi->psl;
                if (data->multi == (Curl_multi *)0x0) {
                  pPVar27 = (PslCache *)0x0;
                }
                data->psl = pPVar27;
              }
              pCVar6->dirty = pCVar6->dirty - 1;
              Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
              data->share = (Curl_share *)0x0;
            }
            if ((pCVar5 != (Curl_share *)0x0) && (pCVar5->magic == 0x7e117a1e)) {
              data->share = pCVar5;
            }
            if (data->share != (Curl_share *)0x0) {
              Curl_share_lock(data,CURL_LOCK_DATA_SHARE,CURL_LOCK_ACCESS_SINGLE);
              pCVar5 = data->share;
              puVar1 = &pCVar5->dirty;
              *puVar1 = *puVar1 + 1;
              if (pCVar5->cookies != (CookieInfo *)0x0) {
                Curl_cookie_cleanup(data->cookies);
                data->cookies = data->share->cookies;
              }
              if (data->share->hsts != (hsts *)0x0) {
                Curl_hsts_cleanup(&data->hsts);
                data->hsts = data->share->hsts;
              }
              if ((data->share->specifier & 0x40) != 0) {
                data->psl = &data->share->psl;
              }
              Curl_share_unlock(data,CURL_LOCK_DATA_SHARE);
              return CURLE_OK;
            }
            return CURLE_OK;
          }
LAB_00154673:
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          CVar29 = setopt_cptr(data,option,(char *)*puVar17);
          return CVar29;
        }
      }
      else {
        uVar13 = option - CURLOPT_MAIL_RCPT;
        if (uVar13 < 0x39) {
          if ((0x100020000010001U >> ((ulong)uVar13 & 0x3f) & 1) != 0) goto LAB_001544cd;
          if ((0x60000000000000U >> ((ulong)uVar13 & 0x3f) & 1) != 0) {
            return CURLE_UNKNOWN_OPTION;
          }
        }
        if (option == CURLOPT_MIMEPOST) {
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          CVar29 = Curl_mime_set_subparts(&(data->set).mimepost,(curl_mime *)*puVar17,0);
          if (CVar29 != CURLE_OK) {
            return CVar29;
          }
          (data->set).method = '\x03';
LAB_00154c49:
          puVar2 = &(data->set).field_0x897;
          *puVar2 = *puVar2 & 0xdf;
          Curl_mime_cleanpart((data->state).formp);
          (*Curl_cfree)((data->state).formp);
          (data->state).mimepost = (curl_mimepart *)0x0;
          (data->state).formp = (curl_mimepart *)0x0;
          goto switchD_001543e6_caseD_5b;
        }
        if (option != CURLOPT_HTTP200ALIASES) goto LAB_00154673;
      }
LAB_001544cd:
      uVar13 = param->gp_offset;
      if ((ulong)uVar13 < 0x29) {
        puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
        param->gp_offset = uVar13 + 8;
      }
      else {
        puVar17 = (undefined8 *)param->overflow_arg_area;
        param->overflow_arg_area = puVar17 + 1;
      }
      pcVar3 = (curl_slist *)*puVar17;
      if ((int)option < 0x2778) {
        if ((int)option < 0x2737) {
          if (option == CURLOPT_HTTPHEADER) {
            (data->set).headers = pcVar3;
          }
          else {
            if (option != CURLOPT_QUOTE) {
              return CURLE_UNKNOWN_OPTION;
            }
            (data->set).quote = pcVar3;
          }
        }
        else if (option == CURLOPT_POSTQUOTE) {
          (data->set).postquote = pcVar3;
        }
        else if (option == CURLOPT_TELNETOPTIONS) {
          (data->set).telnet_options = pcVar3;
        }
        else {
          if (option != CURLOPT_PREQUOTE) {
            return CURLE_UNKNOWN_OPTION;
          }
          (data->set).prequote = pcVar3;
        }
      }
      else if ((int)option < 0x27db) {
        if (option == CURLOPT_HTTP200ALIASES) {
          (data->set).http200aliases = pcVar3;
        }
        else {
          if (option != CURLOPT_MAIL_RCPT) {
            return CURLE_UNKNOWN_OPTION;
          }
          (data->set).mail_rcpt = pcVar3;
        }
      }
      else if (option == CURLOPT_RESOLVE) {
        (data->set).resolve = pcVar3;
        (data->state).resolve = pcVar3;
      }
      else if (option == CURLOPT_CONNECT_TO) {
        (data->set).connect_to = pcVar3;
      }
      else {
        if (option != CURLOPT_PROXYHEADER) {
          return CURLE_UNKNOWN_OPTION;
        }
        (data->set).proxyheaders = pcVar3;
      }
      goto switchD_001543e6_caseD_5b;
    }
    if (option < 30000) {
      CVar29 = CURLE_UNKNOWN_OPTION;
      if ((int)option < 0x4ee4) {
        if ((int)option < 0x4e8c) {
          if ((int)option < 0x4e58) {
            if (option == CURLOPT_WRITEFUNCTION) {
              uVar13 = param->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
                param->gp_offset = uVar13 + 8;
              }
              else {
                plVar16 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar16 + 1;
              }
              pcVar20 = (code *)*plVar16;
              if (pcVar20 == (curl_write_callback)0x0) {
                pcVar20 = fwrite;
              }
              (data->set).fwrite_func = pcVar20;
            }
            else {
              if (option != CURLOPT_READFUNCTION) {
                return CURLE_UNKNOWN_OPTION;
              }
              uVar13 = param->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
                param->gp_offset = uVar13 + 8;
              }
              else {
                plVar16 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar16 + 1;
              }
              p_Var8 = (curl_read_callback)*plVar16;
              (data->set).fread_func_set = p_Var8;
              uVar19 = *(ulong *)&(data->set).field_0x894;
              if (p_Var8 != (curl_read_callback)0x0) {
                uVar19 = uVar19 | 0x10;
                goto LAB_00155d77;
              }
              *(ulong *)&(data->set).field_0x894 = uVar19 & 0xffffffffffffffef;
              (data->set).fread_func_set = fread;
            }
          }
          else {
            if (option == CURLOPT_PROGRESSFUNCTION) {
              uVar13 = param->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
                param->gp_offset = uVar13 + 8;
              }
              else {
                plVar16 = (long *)param->overflow_arg_area;
                param->overflow_arg_area = plVar16 + 1;
              }
              p_Var26 = (curl_progress_callback)*plVar16;
              (data->set).fprogress = p_Var26;
              goto LAB_00155e11;
            }
            if (option == CURLOPT_HEADERFUNCTION) {
              uVar13 = param->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
                param->gp_offset = uVar13 + 8;
              }
              else {
                puVar17 = (undefined8 *)param->overflow_arg_area;
                param->overflow_arg_area = puVar17 + 1;
              }
              (data->set).fwrite_header = (curl_write_callback)*puVar17;
            }
            else {
              if (option != CURLOPT_DEBUGFUNCTION) {
                return CURLE_UNKNOWN_OPTION;
              }
              uVar13 = param->gp_offset;
              if ((ulong)uVar13 < 0x29) {
                puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
                param->gp_offset = uVar13 + 8;
              }
              else {
                puVar17 = (undefined8 *)param->overflow_arg_area;
                param->overflow_arg_area = puVar17 + 1;
              }
              (data->set).fdebug = (curl_debug_callback)*puVar17;
            }
          }
        }
        else if ((int)option < 0x4eb4) {
          if (option == CURLOPT_SSL_CTX_FUNCTION) {
            _Var9 = Curl_ssl_supports(data,8);
            if (!_Var9) {
              return CURLE_NOT_BUILT_IN;
            }
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              puVar17 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar17 + 1;
            }
            (data->set).ssl.fsslctx = (curl_ssl_ctx_callback)*puVar17;
          }
          else {
            if (option != CURLOPT_IOCTLFUNCTION) {
              return CURLE_UNKNOWN_OPTION;
            }
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              puVar17 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar17 + 1;
            }
            (data->set).ioctl_func = (curl_ioctl_callback)*puVar17;
          }
        }
        else if (option == CURLOPT_SOCKOPTFUNCTION) {
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).fsockopt = (curl_sockopt_callback)*puVar17;
        }
        else if (option == CURLOPT_OPENSOCKETFUNCTION) {
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).fopensocket = (curl_opensocket_callback)*puVar17;
        }
        else {
          if (option != CURLOPT_SEEKFUNCTION) {
            return CURLE_UNKNOWN_OPTION;
          }
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).seek_func = (curl_seek_callback)*puVar17;
        }
      }
      else if ((int)option < 0x4f30) {
        switch(option) {
        case CURLOPT_INTERLEAVEFUNCTION:
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).fwrite_rtp = (curl_write_callback)*puVar17;
          break;
        case 0x4ee5:
          goto switchD_001543e6_caseD_ef;
        case CURLOPT_CHUNK_BGN_FUNCTION:
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).chunk_bgn = (curl_chunk_bgn_callback)*puVar17;
          break;
        case CURLOPT_CHUNK_END_FUNCTION:
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).chunk_end = (curl_chunk_end_callback)*puVar17;
          break;
        case CURLOPT_FNMATCH_FUNCTION:
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).fnmatch = (curl_fnmatch_callback)*puVar17;
          break;
        default:
          if (option == CURLOPT_CLOSESOCKETFUNCTION) {
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              puVar17 = (undefined8 *)param->overflow_arg_area;
              param->overflow_arg_area = puVar17 + 1;
            }
            (data->set).fclosesocket = (curl_closesocket_callback)*puVar17;
          }
          else {
            if (option != CURLOPT_XFERINFOFUNCTION) {
              return CURLE_UNKNOWN_OPTION;
            }
            uVar13 = param->gp_offset;
            if ((ulong)uVar13 < 0x29) {
              plVar16 = (long *)((ulong)uVar13 + (long)param->reg_save_area);
              param->gp_offset = uVar13 + 8;
            }
            else {
              plVar16 = (long *)param->overflow_arg_area;
              param->overflow_arg_area = plVar16 + 1;
            }
            p_Var26 = (curl_progress_callback)*plVar16;
            (data->set).fxferinfo = (curl_xferinfo_callback)p_Var26;
LAB_00155e11:
            bVar10 = (data->progress).field_0x1ac;
            if (p_Var26 == (curl_progress_callback)0x0) {
              bVar10 = bVar10 & 0xfe;
            }
            else {
              bVar10 = bVar10 | 1;
            }
            (data->progress).field_0x1ac = bVar10;
          }
        }
      }
      else if ((int)option < 0x4f4d) {
        if (option == CURLOPT_RESOLVER_START_FUNCTION) {
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).resolver_start = (curl_resolver_start_callback)*puVar17;
        }
        else {
          if (option != CURLOPT_TRAILERFUNCTION) {
            return CURLE_UNKNOWN_OPTION;
          }
          uVar13 = param->gp_offset;
          if ((ulong)uVar13 < 0x29) {
            puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
            param->gp_offset = uVar13 + 8;
          }
          else {
            puVar17 = (undefined8 *)param->overflow_arg_area;
            param->overflow_arg_area = puVar17 + 1;
          }
          (data->set).trailer_callback = (curl_trailer_callback)*puVar17;
        }
      }
      else if (option == CURLOPT_HSTSREADFUNCTION) {
        uVar13 = param->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
          param->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar17 + 1;
        }
        (data->set).hsts_read = (curl_hstsread_callback)*puVar17;
      }
      else if (option == CURLOPT_HSTSWRITEFUNCTION) {
        uVar13 = param->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
          param->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar17 + 1;
        }
        (data->set).hsts_write = (curl_hstswrite_callback)*puVar17;
      }
      else {
        if (option != CURLOPT_PREREQFUNCTION) {
          return CURLE_UNKNOWN_OPTION;
        }
        uVar13 = param->gp_offset;
        if ((ulong)uVar13 < 0x29) {
          puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
          param->gp_offset = uVar13 + 8;
        }
        else {
          puVar17 = (undefined8 *)param->overflow_arg_area;
          param->overflow_arg_area = puVar17 + 1;
        }
        (data->set).fprereq = (curl_prereq_callback)*puVar17;
      }
      goto switchD_001543e6_caseD_5b;
    }
    uVar13 = param->gp_offset;
    if (option < 40000) {
      if (uVar13 < 0x29) {
        puVar15 = (ulong *)((ulong)uVar13 + (long)param->reg_save_area);
        param->gp_offset = uVar13 + 8;
      }
      else {
        puVar15 = (ulong *)param->overflow_arg_area;
        param->overflow_arg_area = puVar15 + 1;
      }
      uVar24 = *puVar15;
      CVar14 = option & 0xffff;
      CVar29 = CURLE_UNKNOWN_OPTION;
      if (CVar14 < CURLOPT_MAX_SEND_SPEED_LARGE) {
        switch(CVar14) {
        case CURLOPT_INFILESIZE_LARGE:
          goto switchD_001543e6_caseD_e;
        case CURLOPT_RESUME_FROM_LARGE:
          goto switchD_001543e6_caseD_15;
        case CURLOPT_MAXFILESIZE_LARGE:
          goto switchD_001543e6_caseD_72;
        default:
          goto switchD_001543e6_caseD_ef;
        case CURLOPT_POSTFIELDSIZE_LARGE:
          goto switchD_001543e6_caseD_3c;
        }
      }
      if (CVar14 == CURLOPT_MAX_SEND_SPEED_LARGE) {
        if ((long)uVar24 < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        (data->set).max_send_speed = uVar24;
      }
      else {
        if (CVar14 != CURLOPT_MAX_RECV_SPEED_LARGE) {
          if (CVar14 != CURLOPT_TIMEVALUE_LARGE) {
            return CURLE_UNKNOWN_OPTION;
          }
          goto switchD_001543e6_caseD_22;
        }
        if ((long)uVar24 < 0) {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        (data->set).max_recv_speed = uVar24;
      }
      goto switchD_001543e6_caseD_5b;
    }
    if (uVar13 < 0x29) {
      puVar17 = (undefined8 *)((ulong)uVar13 + (long)param->reg_save_area);
      param->gp_offset = uVar13 + 8;
    }
    else {
      puVar17 = (undefined8 *)param->overflow_arg_area;
      param->overflow_arg_area = puVar17 + 1;
    }
    CVar29 = CURLE_UNKNOWN_OPTION;
    if (0x13 < option - CURLOPT_SSLCERT_BLOB) {
      return CURLE_UNKNOWN_OPTION;
    }
    blob = (curl_blob *)*puVar17;
    switch(option) {
    case CURLOPT_SSLCERT_BLOB:
      blobp = (data->set).blobs;
      break;
    case CURLOPT_SSLKEY_BLOB:
      blobp = (data->set).blobs + 1;
      break;
    case CURLOPT_PROXY_SSLCERT_BLOB:
      blobp = (data->set).blobs + 4;
      break;
    case CURLOPT_PROXY_SSLKEY_BLOB:
      blobp = (data->set).blobs + 5;
      break;
    case CURLOPT_ISSUERCERT_BLOB:
      blobp = (data->set).blobs + 2;
      break;
    default:
      goto switchD_001543e6_caseD_ef;
    case CURLOPT_PROXY_ISSUERCERT_BLOB:
      blobp = (data->set).blobs + 6;
      break;
    case CURLOPT_CAINFO_BLOB:
      _Var9 = Curl_ssl_supports(data,0x40);
      if (!_Var9) {
        return CURLE_NOT_BUILT_IN;
      }
      blobp = (data->set).blobs + 3;
      break;
    case CURLOPT_PROXY_CAINFO_BLOB:
      _Var9 = Curl_ssl_supports(data,0x40);
      CVar29 = CURLE_NOT_BUILT_IN;
      if (_Var9) {
        blobp = (data->set).blobs + 7;
        break;
      }
      goto switchD_001543e6_caseD_ef;
    }
    CVar29 = Curl_setblobopt(blobp,blob);
    return CVar29;
  }
  uVar13 = param->gp_offset;
  if ((ulong)uVar13 < 0x29) {
    puVar15 = (ulong *)((ulong)uVar13 + (long)param->reg_save_area);
    param->gp_offset = uVar13 + 8;
  }
  else {
    puVar15 = (ulong *)param->overflow_arg_area;
    param->overflow_arg_area = puVar15 + 1;
  }
  uVar24 = *puVar15;
  uVar23 = (ushort)uVar24;
  CVar29 = CURLE_NOT_BUILT_IN;
  bVar10 = (byte)uVar24;
  uVar13 = (uint)uVar24;
  switch(option) {
  case CURLOPT_TIMEOUT:
    if (0x20c49b < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timeout = uVar13 * 1000;
    break;
  case CURLOPT_INFILESIZE:
switchD_001543e6_caseD_e:
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).filesize = uVar24;
    break;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x16:
  case CURLOPT_LOW_SPEED_TIME|CURLOPT_PORT:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1c:
  case 0x1d:
  case 0x1e:
  case 0x1f:
  case 0x23:
  case 0x24:
  case 0x25:
  case 0x26:
  case 0x27:
  case 0x28:
  case 0x31:
  case 0x37:
  case 0x38:
  case 0x39:
  case 0x3e:
  case CURLOPT_POSTFIELDSIZE|CURLOPT_PORT:
  case 0x41:
  case 0x42:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_PORT:
  case 0x46:
  case 0x48:
  case 0x49:
  case 0x4c:
  case CURLOPT_SSL_VERIFYPEER|CURLOPT_TIMEOUT:
  case 0x4f:
  case 0x52:
  case CURLOPT_HTTPGET|CURLOPT_PORT:
  case 0x56:
  case CURLOPT_HTTP_VERSION|CURLOPT_PORT:
  case 0x58:
  case 0x59:
  case 0x5d:
  case 0x5e:
  case CURLOPT_DNS_CACHE_TIMEOUT|CURLOPT_PORT:
  case 0x61:
  case 100:
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x6c:
  case CURLOPT_COOKIESESSION|CURLOPT_TIMEOUT:
  case 0x73:
  case 0x74:
  case 0x75:
  case 0x76:
  case 0x78:
  case 0x7a:
  case 0x7b:
  case 0x7c:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_TIMEOUT:
  case CURLOPT_SERVER_RESPONSE_TIMEOUT|CURLOPT_INFILESIZE:
  case 0x7f:
  case 0x80:
  case 0x82:
  case 0x83:
  case 0x84:
  case 0x85:
  case 0x86:
  case 0x87:
  case 0x8e:
  case CURLOPT_LOCALPORTRANGE|CURLOPT_PORT:
  case 0x90:
  case 0x91:
  case 0x92:
  case 0x93:
  case 0x94:
  case 0x95:
  case CURLOPT_SSH_AUTH_TYPES:
  case 0x98:
  case 0x99:
  case CURLOPT_NEW_DIRECTORY_PERMS:
  case 0xa2:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_PORT:
  case 0xa4:
  case 0xa5:
  case 0xa7:
  case 0xa8:
  case 0xa9:
  case 0xaa:
  case 0xad:
  case 0xae:
  case CURLOPT_CERTINFO|CURLOPT_PORT:
  case 0xb0:
  case 0xb1:
  case 0xb3:
  case CURLOPT_SOCKS5_GSSAPI_NEC:
  case 0xb7:
  case 0xb8:
  case 0xb9:
  case 0xba:
  case CURLOPT_NEW_DIRECTORY_PERMS|CURLOPT_CRLF:
  case 0xbe:
  case CURLOPT_FTP_USE_PRET|CURLOPT_PORT:
  case 0xc0:
  case 0xc3:
  case 0xc4:
  case 0xc6:
  case 199:
  case 200:
  case 0xc9:
  case 0xca:
  case 0xcb:
  case 0xcc:
  case 0xcd:
  case 0xce:
  case 0xd0:
  case 0xd1:
  case CURLOPT_GSSAPI_DELEGATION:
  case 0xd3:
  case 0xd9:
  case 0xdb:
  case 0xdc:
  case 0xdd:
  case 0xde:
  case 0xdf:
  case 0xe0:
  case 0xe4:
  case 0xe6:
  case 0xe7:
  case 0xeb:
  case 0xec:
  case 0xee:
  case 0xf0:
  case 0xf1:
  case 0xf3:
  case 0xf6:
  case CURLOPT_TCP_FASTOPEN|CURLOPT_PORT:
  case 0xfb:
  case 0xfc:
  case 0xfd:
  case 0xfe:
  case 0xff:
  case 0x100:
  case 0x101:
  case 0x102:
  case 0x103:
  case 0x104:
  case 0x106:
  case 0x107:
  case 0x108:
  case 0x10a:
  case CURLOPT_SSH_COMPRESSION:
  case 0x10d:
  case 0x10e:
  case 0x110:
  case 0x111:
  case 0x114:
  case 0x115:
  case 0x117:
  case 0x11a:
  case CURLOPT_UPLOAD_BUFFERSIZE|CURLOPT_PORT:
  case 0x11c:
  case 0x11f:
  case 0x121:
  case 0x123:
  case 0x124:
  case 0x125:
  case 0x126:
  case 0x127:
  case 0x128:
  case 0x129:
  case 0x12a:
  case 300:
  case CURLOPT_MAXAGE_CONN|CURLOPT_TIMEOUT:
  case CURLOPT_MAXAGE_CONN|CURLOPT_INFILESIZE:
  case 0x12f:
  case 0x130:
  case 0x131:
  case 0x135:
  case 0x136:
  case CURLOPT_DOH_SSL_VERIFYSTATUS|CURLOPT_PORT:
  case 0x138:
  case 0x139:
  case 0x13c:
  case 0x13d:
  case 0x13e:
  case 0x13f:
  case 0x143:
  case 0x145:
    return CURLE_UNKNOWN_OPTION;
  case CURLOPT_LOW_SPEED_LIMIT:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_limit = uVar24;
    break;
  case CURLOPT_LOW_SPEED_TIME:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).low_speed_time = uVar24;
    break;
  case CURLOPT_RESUME_FROM:
switchD_001543e6_caseD_15:
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).set_resume_from = uVar24;
    break;
  case CURLOPT_CRLF:
    uVar19 = (ulong)(uVar24 != 0) << 8;
    uVar24 = 0xfffffffffffffeff;
    goto LAB_00155bbd;
  case CURLOPT_SSLVERSION:
  case CURLOPT_PROXY_SSLVERSION:
    if (0x7ffff < (uVar13 & 0xffff0000)) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar13 & 0xfffe) == 2) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if ((uVar24 & 0xfff8) != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    psVar28 = &(data->set).ssl;
    if (option != CURLOPT_SSLVERSION) {
      psVar28 = &(data->set).proxy_ssl;
    }
    (psVar28->primary).version = bVar10;
    (psVar28->primary).version_max = uVar13 & 0xffff0000;
    break;
  case CURLOPT_TIMECONDITION:
    if (3 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).timecondition = bVar10;
    break;
  case CURLOPT_TIMEVALUE:
switchD_001543e6_caseD_22:
    (data->set).timevalue = uVar24;
    break;
  case CURLOPT_VERBOSE:
    uVar19 = (ulong)((uint)(uVar24 != 0) << 0x1e);
    uVar24 = 0xffffffffbfffffff;
    goto LAB_00155bbd;
  case CURLOPT_HEADER:
    uVar19 = (ulong)((uint)(uVar24 != 0) << 0x1a);
    uVar24 = 0xfffffffffbffffff;
    goto LAB_00155bbd;
  case CURLOPT_NOPROGRESS:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffffdfffff | (ulong)(uVar24 != 0) << 0x15;
    uVar13 = (data->progress).flags;
    if (uVar24 == 0) {
      uVar13 = uVar13 & 0xffffffef;
    }
    else {
      uVar13 = uVar13 | 0x10;
    }
    (data->progress).flags = uVar13;
    break;
  case CURLOPT_NOBODY:
    *(ulong *)&(data->set).field_0x894 =
         *(ulong *)&(data->set).field_0x894 & 0xffffffffdfffffff |
         (ulong)((uint)(uVar24 != 0) << 0x1d);
    if (uVar24 == 0) {
      if ((data->set).method == '\x05') goto LAB_00155ead;
    }
    else {
      (data->set).method = '\x05';
    }
    break;
  case CURLOPT_FAILONERROR:
    uVar19 = (ulong)(uVar24 != 0) << 0x16;
    uVar24 = 0xffffffffffbfffff;
    goto LAB_00155bbd;
  case CURLOPT_UPLOAD:
  case CURLOPT_PUT:
    if (uVar24 == 0) goto LAB_00155ead;
    (data->set).method = '\x04';
LAB_0015557e:
    puVar2 = &(data->set).field_0x897;
    *puVar2 = *puVar2 & 0xdf;
    break;
  case CURLOPT_POST:
    if (uVar24 != 0) {
      (data->set).method = '\x01';
      goto LAB_0015557e;
    }
LAB_00155ead:
    (data->set).method = '\0';
    break;
  case CURLOPT_DIRLISTONLY:
    uVar19 = (ulong)(uVar24 != 0) << 0xe;
    uVar24 = 0xffffffffffffbfff;
    goto LAB_00155bbd;
  case CURLOPT_APPEND:
    uVar19 = (ulong)(uVar24 != 0) << 0xd;
    uVar24 = 0xffffffffffffdfff;
    goto LAB_00155bbd;
  case CURLOPT_NETRC:
    if (2 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_netrc = bVar10;
    break;
  case CURLOPT_FOLLOWLOCATION:
    if (3 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).http_follow_mode = bVar10;
    break;
  case CURLOPT_TRANSFERTEXT:
    uVar19 = (ulong)(uVar24 != 0) << 0xc;
    uVar24 = 0xffffffffffffefff;
    goto LAB_00155bbd;
  case CURLOPT_AUTOREFERER:
    uVar19 = (ulong)((uint)(uVar24 != 0) << 0x1c);
    uVar24 = 0xffffffffefffffff;
    goto LAB_00155bbd;
  case CURLOPT_PROXYPORT:
    if (0xffff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxyport = uVar23;
    break;
  case CURLOPT_POSTFIELDSIZE:
switchD_001543e6_caseD_3c:
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (((data->set).postfieldsize < (long)uVar24) &&
       (pcVar4 = (data->set).str[0x49], (char *)(data->set).postfields == pcVar4)) {
      (*Curl_cfree)(pcVar4);
      (data->set).str[0x49] = (char *)0x0;
      (data->set).postfields = (void *)0x0;
    }
    (data->set).postfieldsize = uVar24;
    break;
  case CURLOPT_HTTPPROXYTUNNEL:
    uVar19 = (ulong)(uVar24 != 0) << 0xb;
    uVar24 = 0xfffffffffffff7ff;
    goto LAB_00155bbd;
  case CURLOPT_SSL_VERIFYPEER:
    bVar10 = uVar24 != 0;
    bVar22 = (data->set).ssl.primary.field_0x79 & 0xfe;
    goto LAB_00155349;
  case CURLOPT_MAXREDIRS:
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxredirs = uVar24;
    break;
  case CURLOPT_FILETIME:
    uVar19 = (ulong)(uVar24 != 0) << 10;
    uVar24 = 0xfffffffffffffbff;
    goto LAB_00155bbd;
  case CURLOPT_MAXCONNECTS:
    if (uVar24 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxconnects = uVar13;
    break;
  case CURLOPT_FRESH_CONNECT:
    uVar19 = (ulong)(uVar24 != 0) << 0x20;
    uVar24 = 0xfffffffeffffffff;
    goto LAB_00155bbd;
  case CURLOPT_FORBID_REUSE:
    uVar19 = (ulong)((uint)(uVar24 != 0) << 0x1f);
    uVar24 = 0xffffffff7fffffff;
    goto LAB_00155bbd;
  case CURLOPT_CONNECTTIMEOUT:
    if (0x20c49b < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).connecttimeout = uVar13 * 1000;
    break;
  case CURLOPT_HTTPGET:
    if (uVar24 != 0) {
      (data->set).method = '\0';
      goto LAB_0015557e;
    }
    break;
  case CURLOPT_SSL_VERIFYHOST:
    bVar10 = (uVar24 != 0) * '\x02';
    bVar22 = (data->set).ssl.primary.field_0x79 & 0xfd;
    goto LAB_00155349;
  case CURLOPT_HTTP_VERSION:
    if (2 < uVar24) {
      if ((long)uVar24 < 0) {
        return CURLE_BAD_FUNCTION_ARGUMENT;
      }
      return CURLE_UNSUPPORTED_PROTOCOL;
    }
    (data->set).httpwant = bVar10;
    break;
  case CURLOPT_FTP_USE_EPSV:
    uVar19 = (ulong)(uVar24 != 0) << 0x10;
    uVar24 = 0xfffffffffffeffff;
    goto LAB_00155bbd;
  case CURLOPT_SSLENGINE_DEFAULT:
    (*Curl_cfree)((data->set).str[0x2c]);
    (data->set).str[0x2c] = (char *)0x0;
    CVar29 = Curl_ssl_set_engine_default(data);
    return CVar29;
  case CURLOPT_DNS_USE_GLOBAL_CACHE:
  case CURLOPT_SSL_ENABLE_NPN:
    break;
  case CURLOPT_DNS_CACHE_TIMEOUT:
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = 0x7fffffff;
    if ((long)uVar24 < 0x7fffffff) {
      uVar19 = uVar24;
    }
    (data->set).dns_cache_timeout = (int)uVar19;
    break;
  case CURLOPT_COOKIESESSION:
    uVar19 = (ulong)(uVar24 != 0) << 7;
    uVar24 = 0xffffffffffffff7f;
    goto LAB_00155bbd;
  case CURLOPT_BUFFERSIZE:
    uVar13 = 0xa00000;
    if ((long)uVar24 < 0xa00001) {
      if ((long)uVar24 < 1) {
        uVar13 = 0x4000;
      }
      else {
        uVar19 = 0x400;
        if (0x400 < (long)uVar24) {
          uVar19 = uVar24;
        }
        uVar13 = (uint)uVar19;
      }
    }
    (data->set).buffer_size = uVar13;
    break;
  case CURLOPT_NOSIGNAL:
    uVar19 = (ulong)(uVar24 != 0) << 0x21;
    uVar24 = 0xfffffffdffffffff;
    goto LAB_00155bbd;
  case CURLOPT_PROXYTYPE:
    if (7 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).proxytype = bVar10;
    break;
  case CURLOPT_UNRESTRICTED_AUTH:
    uVar19 = (ulong)((uint)(uVar24 != 0) << 0x19);
    uVar24 = 0xfffffffffdffffff;
    goto LAB_00155bbd;
  case CURLOPT_FTP_USE_EPRT:
    uVar19 = (ulong)(uVar24 != 0) << 0x11;
    uVar24 = 0xfffffffffffdffff;
    goto LAB_00155bbd;
  case CURLOPT_HTTPAUTH:
    _Var9 = false;
    goto LAB_001551bc;
  case CURLOPT_FTP_CREATE_MISSING_DIRS:
    if (2 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_create_missing_dirs = bVar10;
    break;
  case CURLOPT_PROXYAUTH:
    _Var9 = true;
LAB_001551bc:
    CVar29 = httpauth(data,_Var9,uVar24);
    return CVar29;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT:
    if (0x20c49b < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar13 * 1000;
    break;
  case CURLOPT_IPRESOLVE:
    if (2 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ipver = bVar10;
    break;
  case CURLOPT_MAXFILESIZE:
switchD_001543e6_caseD_72:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).max_filesize = uVar24;
    break;
  case CURLOPT_USE_SSL:
    if (3 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_ssl = bVar10;
    break;
  case CURLOPT_TCP_NODELAY:
    uVar19 = (ulong)(uVar24 != 0) << 0x22;
    uVar24 = 0xfffffffbffffffff;
    goto LAB_00155bbd;
  case CURLOPT_FTPSSLAUTH:
    if (2 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftpsslauth = bVar10;
    break;
  case CURLOPT_IGNORE_CONTENT_LENGTH:
    uVar19 = (ulong)(uVar24 != 0) << 0x23;
    uVar24 = 0xfffffff7ffffffff;
    goto LAB_00155bbd;
  case CURLOPT_FTP_SKIP_PASV_IP:
    uVar19 = (ulong)(uVar24 != 0) << 0x13;
    uVar24 = 0xfffffffffff7ffff;
    goto LAB_00155bbd;
  case CURLOPT_FTP_FILEMETHOD:
    if (3 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_filemethod = bVar10;
    break;
  case CURLOPT_LOCALPORT:
    if (0xffff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar12 = curlx_sltous(uVar24);
    (data->set).localport = uVar12;
    break;
  case CURLOPT_LOCALPORTRANGE:
    if (0xffff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar12 = curlx_sltous(uVar24);
    (data->set).localportrange = uVar12;
    break;
  case CURLOPT_CONNECT_ONLY:
    if (2 < (long)uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = (ulong)(uVar24 != 0) + (ulong)(uVar24 == 2) * 2 |
             *(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffc;
    goto LAB_00155d77;
  case CURLOPT_SSL_SESSIONID_CACHE:
    bVar22 = (uVar24 != 0) << 3;
    bVar10 = (data->set).proxy_ssl.primary.field_0x79;
    (data->set).ssl.primary.field_0x79 = (data->set).ssl.primary.field_0x79 & 0xf7 | bVar22;
    (data->set).proxy_ssl.primary.field_0x79 = bVar10 & 0xf7 | bVar22;
    break;
  case CURLOPT_FTP_SSL_CCC:
    if (2 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).ftp_ccc = bVar10;
    break;
  case CURLOPT_TIMEOUT_MS:
    uVar19 = 0xffffffff;
    if (uVar24 < 0xffffffff) {
      uVar19 = uVar24;
    }
    (data->set).timeout = (uint)uVar19;
    break;
  case CURLOPT_CONNECTTIMEOUT_MS:
    uVar19 = 0xffffffff;
    if (uVar24 < 0xffffffff) {
      uVar19 = uVar24;
    }
    (data->set).connecttimeout = (uint)uVar19;
    break;
  case CURLOPT_HTTP_TRANSFER_DECODING:
    uVar19 = (ulong)(uVar24 == 0) << 0x24;
    uVar24 = 0xffffffefffffffff;
    goto LAB_00155bbd;
  case CURLOPT_HTTP_CONTENT_DECODING:
    uVar19 = (ulong)(uVar24 == 0) << 0x25;
    uVar24 = 0xffffffdfffffffff;
    goto LAB_00155bbd;
  case CURLOPT_NEW_FILE_PERMS:
    if (0x1ff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).new_file_perms = uVar13;
    break;
  case CURLOPT_POSTREDIR:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).keep_post = bVar10 & 7;
    break;
  case CURLOPT_PROXY_TRANSFER_MODE:
    if (1 < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar24 = uVar24 << 0x26;
    uVar19 = 0xffffffbfffffffff;
    goto LAB_00155b98;
  case CURLOPT_ADDRESS_SCOPE:
    if (uVar24 >> 0x20 != 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).scope_id = uVar13;
    break;
  case CURLOPT_CERTINFO:
    _Var9 = Curl_ssl_supports(data,2);
    if (!_Var9) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar11 = (ushort)(uVar24 != 0);
    uVar23 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffe;
    goto LAB_001558c2;
  case CURLOPT_TFTP_BLKSIZE:
    uVar19 = 0xffb8;
    if ((long)uVar24 < 0xffb8) {
      uVar19 = uVar24;
    }
    uVar25 = 0x200;
    if (7 < (long)uVar24) {
      uVar25 = uVar19;
    }
    (data->set).tftp_blksize = uVar25;
    break;
  case CURLOPT_PROTOCOLS:
    (data->set).allowed_protocols = uVar13;
    break;
  case CURLOPT_REDIR_PROTOCOLS:
    (data->set).redir_protocols = uVar13;
    break;
  case CURLOPT_FTP_USE_PRET:
    uVar19 = (ulong)(uVar24 != 0) << 0x12;
    uVar24 = 0xfffffffffffbffff;
    goto LAB_00155bbd;
  case CURLOPT_RTSP_REQUEST:
    if (10 < uVar24 - 1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).rtspreq = (int)(uVar24 - 1) + RTSPREQ_OPTIONS;
    break;
  case CURLOPT_RTSP_CLIENT_CSEQ:
    (data->state).rtsp_next_client_CSeq = uVar24;
    break;
  case CURLOPT_RTSP_SERVER_CSEQ:
    (data->state).rtsp_next_server_CSeq = uVar24;
    break;
  case CURLOPT_WILDCARDMATCH:
    uVar19 = (ulong)(uVar24 != 0) << 0x14;
    uVar24 = 0xffffffffffefffff;
    goto LAB_00155bbd;
  case CURLOPT_TRANSFER_ENCODING:
    uVar19 = (ulong)(uVar24 != 0) << 0x18;
    uVar24 = 0xfffffffffeffffff;
    goto LAB_00155bbd;
  case CURLOPT_ACCEPTTIMEOUT_MS:
    uVar19 = 0xffffffff;
    if (uVar24 < 0xffffffff) {
      uVar19 = uVar24;
    }
    (data->set).accepttimeout = (uint)uVar19;
    break;
  case CURLOPT_TCP_KEEPALIVE:
    uVar19 = (ulong)(uVar24 != 0) << 0x28;
    uVar24 = 0xfffffeffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_TCP_KEEPIDLE:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = 0x7fffffff;
    if ((long)uVar24 < 0x7fffffff) {
      uVar19 = uVar24;
    }
    (data->set).tcp_keepidle = (int)uVar19;
    break;
  case CURLOPT_TCP_KEEPINTVL:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = 0x7fffffff;
    if ((long)uVar24 < 0x7fffffff) {
      uVar19 = uVar24;
    }
    (data->set).tcp_keepintvl = (int)uVar19;
    break;
  case CURLOPT_SSL_OPTIONS:
    (data->set).ssl.primary.ssl_options = bVar10;
    uVar11 = (ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfe03;
    uVar23 = ((ushort)(uVar24 >> 4) & 4) + (uVar23 & 0x3f) * 8;
LAB_001558c2:
    *(ushort *)&(data->set).ssl.field_0xc0 = uVar23 | uVar11;
    break;
  case CURLOPT_SASL_IR:
    uVar19 = (ulong)(uVar24 != 0) << 0x27;
    uVar24 = 0xffffff7fffffffff;
    goto LAB_00155bbd;
  case CURLOPT_SSL_ENABLE_ALPN:
    uVar19 = (ulong)(uVar24 != 0) << 0x2a;
    uVar24 = 0xfffffbffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_EXPECT_100_TIMEOUT_MS:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).expect_100_timeout = uVar24;
    break;
  case CURLOPT_HEADEROPT:
    uVar24 = (ulong)((uVar13 & 1) << 6);
    uVar19 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffbf;
    goto LAB_00155b9f;
  case CURLOPT_SSL_VERIFYSTATUS:
    _Var9 = Curl_ssl_cert_status_request();
    if (!_Var9) {
      return CURLE_NOT_BUILT_IN;
    }
    bVar10 = (uVar24 != 0) << 2;
    bVar22 = (data->set).ssl.primary.field_0x79 & 0xfb;
LAB_00155349:
    (data->set).ssl.primary.field_0x79 = bVar22 | bVar10;
    _Var9 = false;
LAB_001559c8:
    Curl_ssl_conn_config_update(data,_Var9);
    break;
  case CURLOPT_SSL_FALSESTART:
    _Var9 = Curl_ssl_false_start();
    if (!_Var9) {
      return CURLE_NOT_BUILT_IN;
    }
    *(ushort *)&(data->set).ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).ssl.field_0xc0 & 0xfffd) + (ushort)(uVar24 != 0) * 2;
    break;
  case CURLOPT_PATH_AS_IS:
    uVar19 = (ulong)(uVar24 != 0) << 0x2b;
    uVar24 = 0xfffff7ffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_PIPEWAIT:
    uVar19 = (ulong)(uVar24 != 0) << 0x2c;
    uVar24 = 0xffffefffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_STREAM_WEIGHT:
    goto switchD_001543e6_caseD_ef;
  case CURLOPT_TFTP_NO_OPTIONS:
    uVar19 = (ulong)(uVar24 != 0) << 5;
    uVar24 = *(ulong *)&(data->set).field_0x894 & 0xffffffffffffffdf;
    goto LAB_00155bc4;
  case CURLOPT_TCP_FASTOPEN:
    uVar19 = (ulong)(uVar24 != 0) << 0x29;
    uVar24 = 0xfffffdffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_KEEP_SENDING_ON_ERROR:
    uVar19 = (ulong)(uVar24 != 0) << 0x17;
    uVar24 = 0xffffffffff7fffff;
    goto LAB_00155bbd;
  case CURLOPT_PROXY_SSL_VERIFYPEER:
    bVar10 = uVar24 != 0;
    bVar22 = (data->set).proxy_ssl.primary.field_0x79 & 0xfe;
    goto LAB_001559b8;
  case CURLOPT_PROXY_SSL_VERIFYHOST:
    bVar10 = (uVar24 != 0) * '\x02';
    bVar22 = (data->set).proxy_ssl.primary.field_0x79 & 0xfd;
LAB_001559b8:
    (data->set).proxy_ssl.primary.field_0x79 = bVar22 | bVar10;
    _Var9 = true;
    goto LAB_001559c8;
  case CURLOPT_PROXY_SSL_OPTIONS:
    (data->set).proxy_ssl.primary.ssl_options = bVar10;
    *(ushort *)&(data->set).proxy_ssl.field_0xc0 =
         ((ushort)*(undefined4 *)&(data->set).proxy_ssl.field_0xc0 & 0xfe07) + (uVar23 & 0x3f) * 8;
    break;
  case CURLOPT_SUPPRESS_CONNECT_HEADERS:
    uVar19 = (ulong)(uVar24 != 0) << 0x2d;
    uVar24 = 0xffffdfffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_SOCKS5_AUTH:
    if ((uVar24 & 0xfffffffffffffffa) != 0) {
      return CURLE_NOT_BUILT_IN;
    }
    (data->set).socks5auth = bVar10;
    break;
  case CURLOPT_HAPPY_EYEBALLS_TIMEOUT_MS:
    uVar19 = 0xffffffff;
    if (uVar24 < 0xffffffff) {
      uVar19 = uVar24;
    }
    (data->set).happy_eyeballs_timeout = (uint)uVar19;
    break;
  case CURLOPT_HAPROXYPROTOCOL:
    uVar19 = (ulong)(uVar24 != 0) << 0x2f;
    uVar24 = 0xffff7fffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_DNS_SHUFFLE_ADDRESSES:
    uVar19 = (ulong)(uVar24 != 0) << 0x2e;
    uVar24 = 0xffffbfffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_DISALLOW_USERNAME_IN_URL:
    uVar19 = (ulong)(uVar24 != 0) << 0x31;
    uVar24 = 0xfffdffffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_UPLOAD_BUFFERSIZE:
    uVar19 = 0x4000;
    if (0x4000 < (long)uVar24) {
      uVar19 = uVar24;
    }
    if (0x1fffff < (long)uVar19) {
      uVar19 = 0x200000;
    }
    (data->set).upload_buffer_size = (uint)uVar19;
    break;
  case CURLOPT_UPKEEP_INTERVAL_MS:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).upkeep_interval_ms = uVar24;
    break;
  case CURLOPT_HTTP09_ALLOWED:
    uVar19 = (ulong)(uVar24 != 0) << 0x36;
    uVar24 = 0xffbfffffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_ALTSVC_CTRL:
    if (uVar24 == 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    if (data->asi == (altsvcinfo *)0x0) {
      paVar18 = Curl_altsvc_init();
      data->asi = paVar18;
      if (paVar18 == (altsvcinfo *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    CVar29 = Curl_altsvc_ctrl(data->asi,uVar24);
    return CVar29;
  case CURLOPT_MAXAGE_CONN:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxage_conn = uVar24;
    break;
  case CURLOPT_MAIL_RCPT_ALLOWFAILS:
    uVar19 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffffb) + (ulong)(uVar24 != 0) * 4;
    goto LAB_00155d77;
  case CURLOPT_HSTS_CTRL:
    hp = &data->hsts;
    if ((uVar24 & 1) == 0) {
      Curl_hsts_cleanup(hp);
    }
    else if (*hp == (hsts *)0x0) {
      phVar21 = Curl_hsts_init();
      *hp = phVar21;
      if (phVar21 == (hsts *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
    }
    break;
  case CURLOPT_DOH_SSL_VERIFYPEER:
    uVar19 = (ulong)(uVar24 != 0) << 0x33;
    uVar24 = 0xfff7ffffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_DOH_SSL_VERIFYHOST:
    uVar19 = (ulong)(uVar24 != 0) << 0x34;
    uVar24 = 0xffefffffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_DOH_SSL_VERIFYSTATUS:
    _Var9 = Curl_ssl_cert_status_request();
    if (!_Var9) {
      return CURLE_NOT_BUILT_IN;
    }
    uVar19 = (ulong)(uVar24 != 0) << 0x35;
    uVar24 = 0xffdfffffffffffff;
    goto LAB_00155bbd;
  case CURLOPT_MAXLIFETIME_CONN:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).maxlifetime_conn = uVar24;
    break;
  case CURLOPT_MIME_OPTIONS:
    uVar19 = (*(ulong *)&(data->set).field_0x894 & 0xfffffffffffffff7) + (ulong)(uVar13 & 1) * 8;
    goto LAB_00155d77;
  case CURLOPT_WS_OPTIONS:
    uVar24 = (ulong)(uVar13 & 1) << 0x37;
    uVar19 = 0xff7fffffffffffff;
LAB_00155b98:
    uVar19 = uVar19 & *(ulong *)&(data->set).field_0x894;
LAB_00155b9f:
    uVar19 = uVar19 | uVar24;
LAB_00155d77:
    *(ulong *)&(data->set).field_0x894 = uVar19;
    break;
  case CURLOPT_CA_CACHE_TIMEOUT:
    _Var9 = Curl_ssl_supports(data,0x100);
    if (!_Var9) {
      return CURLE_NOT_BUILT_IN;
    }
    if ((long)uVar24 < -1) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = 0x7fffffff;
    if ((long)uVar24 < 0x7fffffff) {
      uVar19 = uVar24;
    }
    (data->set).general_ssl.ca_cache_timeout = (int)uVar19;
    break;
  case CURLOPT_QUICK_EXIT:
    uVar19 = (ulong)(uVar24 != 0) << 9;
    uVar24 = 0xfffffffffffffdff;
LAB_00155bbd:
    uVar24 = uVar24 & *(ulong *)&(data->set).field_0x894;
LAB_00155bc4:
    *(ulong *)&(data->set).field_0x894 = uVar24 | uVar19;
    break;
  case CURLOPT_SERVER_RESPONSE_TIMEOUT_MS:
    if (0x7fffffff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).server_response_timeout = uVar13;
    break;
  case CURLOPT_TCP_KEEPCNT:
    if ((long)uVar24 < 0) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    uVar19 = 0x7fffffff;
    if ((long)uVar24 < 0x7fffffff) {
      uVar19 = uVar24;
    }
    (data->set).tcp_keepcnt = (int)uVar19;
    break;
  case CURLOPT_UPLOAD_FLAGS:
    (data->set).upload_flags = bVar10;
    break;
  default:
    if (option != CURLOPT_PORT) {
      return CURLE_UNKNOWN_OPTION;
    }
    if (0xffff < uVar24) {
      return CURLE_BAD_FUNCTION_ARGUMENT;
    }
    (data->set).use_port = uVar23;
  }
switchD_001543e6_caseD_5b:
  CVar29 = CURLE_OK;
switchD_001543e6_caseD_ef:
  return CVar29;
}

Assistant:

CURLcode Curl_vsetopt(struct Curl_easy *data, CURLoption option, va_list param)
{
  if(option < CURLOPTTYPE_OBJECTPOINT)
    return setopt_long(data, option, va_arg(param, long));
  else if(option < CURLOPTTYPE_FUNCTIONPOINT) {
    /* unfortunately, different pointer types cannot be identified any other
       way than being listed explicitly */
    switch(option) {
    case CURLOPT_HTTPHEADER:
    case CURLOPT_QUOTE:
    case CURLOPT_POSTQUOTE:
    case CURLOPT_TELNETOPTIONS:
    case CURLOPT_PREQUOTE:
    case CURLOPT_HTTP200ALIASES:
    case CURLOPT_MAIL_RCPT:
    case CURLOPT_RESOLVE:
    case CURLOPT_PROXYHEADER:
    case CURLOPT_CONNECT_TO:
      return setopt_slist(data, option, va_arg(param, struct curl_slist *));
    case CURLOPT_HTTPPOST:         /* curl_httppost * */
    case CURLOPT_MIMEPOST:         /* curl_mime * */
    case CURLOPT_STDERR:           /* FILE * */
    case CURLOPT_SHARE:            /* CURLSH * */
    case CURLOPT_STREAM_DEPENDS:   /* CURL * */
    case CURLOPT_STREAM_DEPENDS_E: /* CURL * */
      return setopt_pointers(data, option, param);
    default:
      break;
    }
    /* the char pointer options */
    return setopt_cptr(data, option, va_arg(param, char *));
  }
  else if(option < CURLOPTTYPE_OFF_T)
    return setopt_func(data, option, param);
  else if(option < CURLOPTTYPE_BLOB)
    return setopt_offt(data, option, va_arg(param, curl_off_t));
  return setopt_blob(data, option, va_arg(param, struct curl_blob *));
}